

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpInputStream::Request> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readRequest(HttpInputStreamImpl *this)

{
  Coroutine<kj::HttpInputStream::Request> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  undefined4 uVar1;
  long lVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  undefined8 in_RSI;
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  HttpInputStream local_78;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> WStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  PromiseBase local_48;
  undefined4 local_40;
  undefined4 local_38;
  
  handle._M_fr_ptr = operator_new(0x4e8);
  *(code **)handle._M_fr_ptr = readRequest;
  *(code **)((long)handle._M_fr_ptr + 8) = readRequest;
  this_00 = (Coroutine<kj::HttpInputStream::Request> *)((long)handle._M_fr_ptr + 0x10);
  *(undefined8 *)((long)handle._M_fr_ptr + 0x4d8) = in_RSI;
  local_68 = 0x4d3fd6;
  uStack_64 = 0;
  uStack_60 = 0x4d4f79;
  uStack_5c = 0;
  local_58 = 0x58a;
  uStack_54 = 0x18;
  location.function = "readRequest";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x58a;
  location.columnNumber = 0x18;
  kj::_::Coroutine<kj::HttpInputStream::Request>::Coroutine(this_00,handle,location);
  local_48.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::Coroutine<kj::HttpInputStream::Request>::get_return_object
            ((Coroutine<kj::HttpInputStream::Request> *)this);
  this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x4d0);
  readRequestHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)((long)handle._M_fr_ptr + 0x268);
  co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x4e0) = 0;
  bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar3) {
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                    *)((long)handle._M_fr_ptr + 0x460),__return_storage_ptr__);
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    if (((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
          *)((long)handle._M_fr_ptr + 0x460))->tag != 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
                ((Fault *)&stack0xffffffffffffff88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x58d,FAILED,"requestOrProtocolError.tryGet<HttpHeaders::Request>() != nullptr",
                 "\"bad request\"",(char (*) [12])"bad request");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff88);
    }
    lVar2 = *(long *)((long)handle._M_fr_ptr + 0x4d8);
    uVar1 = *(undefined4 *)((long)handle._M_fr_ptr + 0x468);
    local_58 = *(undefined4 *)((long)handle._M_fr_ptr + 0x47c);
    local_68 = (undefined4)*(undefined8 *)((long)handle._M_fr_ptr + 0x46c);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)((long)handle._M_fr_ptr + 0x46c) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)((long)handle._M_fr_ptr + 0x474);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)((long)handle._M_fr_ptr + 0x474) >> 0x20);
    local_40 = 1;
    local_38 = uVar1;
    getEntityBody((HttpInputStreamImpl *)&stack0xffffffffffffff88,(RequestOrResponse)lVar2,
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)&stack0xffffffffffffffc0
                  ,(HttpHeaders *)0x0);
    local_40 = 0;
    *(undefined4 *)((long)handle._M_fr_ptr + 0x4a0) = uVar1;
    *(ulong *)((long)handle._M_fr_ptr + 0x4a8) = CONCAT44(uStack_60,uStack_64);
    *(ulong *)((long)handle._M_fr_ptr + 0x4b0) = CONCAT44(local_58,uStack_5c);
    *(long *)((long)handle._M_fr_ptr + 0x4b8) = lVar2 + 0x48;
    *(_func_int ***)((long)handle._M_fr_ptr + 0x4c0) = local_78._vptr_HttpInputStream;
    ((Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> *)
    ((long)handle._M_fr_ptr + 0x4c8))->ptr =
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)WStack_70.currentWrapper.ptr;
    WStack_70.currentWrapper.ptr =
         (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
    kj::_::Coroutine<kj::HttpInputStream::Request>::fulfill
              (this_00,(FixVoid<kj::HttpInputStream::Request> *)((long)handle._M_fr_ptr + 0x4a0));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x4c0));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)&stack0xffffffffffffff88);
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x4e0) = 1;
  }
  return (Promise<kj::HttpInputStream::Request>)(PromiseNode *)local_48.node.ptr;
}

Assistant:

kj::Promise<Request> readRequest() override {
    auto requestOrProtocolError = co_await readRequestHeaders();
    auto request = KJ_REQUIRE_NONNULL(
        requestOrProtocolError.tryGet<HttpHeaders::Request>(), "bad request");
    auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);

    co_return { request.method, request.url, headers, kj::mv(body) };
  }